

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.cpp
# Opt level: O0

Structure * __thiscall polyscope::Structure::setTransparency(Structure *this,double newVal)

{
  Structure *in_RDI;
  PersistentValue<float> *in_XMM0_Qa;
  
  PersistentValue<float>::operator=(in_XMM0_Qa,(double *)in_RDI);
  if (((double)in_XMM0_Qa < 1.0) && (options::transparencyMode == 0)) {
    options::transparencyMode = 2;
  }
  requestRedraw();
  return in_RDI;
}

Assistant:

Structure* Structure::setTransparency(double newVal) {
  transparency = newVal;

  if (newVal < 1. && options::transparencyMode == TransparencyMode::None) {
    options::transparencyMode = TransparencyMode::Pretty;
  }
  requestRedraw();

  return this;
}